

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

uint64_t __thiscall mkvmuxer::MasteringMetadata::PayloadSize(MasteringMetadata *this)

{
  float fVar1;
  PrimaryChromaticity *pPVar2;
  uint64 uVar3;
  uint64 uVar4;
  uint64 uVar5;
  
  fVar1 = this->luminance_max_;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    uVar3 = EbmlElementSize(0x55d9,fVar1);
  }
  else {
    uVar3 = 0;
  }
  fVar1 = this->luminance_min_;
  if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
    uVar4 = EbmlElementSize(0x55da,fVar1);
    uVar3 = uVar3 + uVar4;
  }
  pPVar2 = this->r_;
  if (pPVar2 != (PrimaryChromaticity *)0x0) {
    uVar4 = EbmlElementSize(0x55d1,pPVar2->x_);
    uVar5 = EbmlElementSize(0x55d2,pPVar2->y_);
    uVar3 = uVar4 + uVar3 + uVar5;
  }
  pPVar2 = this->g_;
  if (pPVar2 != (PrimaryChromaticity *)0x0) {
    uVar4 = EbmlElementSize(0x55d3,pPVar2->x_);
    uVar5 = EbmlElementSize(0x55d4,pPVar2->y_);
    uVar3 = uVar4 + uVar3 + uVar5;
  }
  pPVar2 = this->b_;
  if (pPVar2 != (PrimaryChromaticity *)0x0) {
    uVar4 = EbmlElementSize(0x55d5,pPVar2->x_);
    uVar5 = EbmlElementSize(0x55d6,pPVar2->y_);
    uVar3 = uVar4 + uVar3 + uVar5;
  }
  pPVar2 = this->white_point_;
  if (pPVar2 != (PrimaryChromaticity *)0x0) {
    uVar4 = EbmlElementSize(0x55d7,pPVar2->x_);
    uVar5 = EbmlElementSize(0x55d8,pPVar2->y_);
    uVar3 = uVar4 + uVar3 + uVar5;
  }
  return uVar3;
}

Assistant:

uint64_t MasteringMetadata::PayloadSize() const {
  uint64_t size = 0;

  if (luminance_max_ != kValueNotPresent)
    size += EbmlElementSize(libwebm::kMkvLuminanceMax, luminance_max_);
  if (luminance_min_ != kValueNotPresent)
    size += EbmlElementSize(libwebm::kMkvLuminanceMin, luminance_min_);

  if (r_) {
    size += r_->PrimaryChromaticitySize(libwebm::kMkvPrimaryRChromaticityX,
                                        libwebm::kMkvPrimaryRChromaticityY);
  }
  if (g_) {
    size += g_->PrimaryChromaticitySize(libwebm::kMkvPrimaryGChromaticityX,
                                        libwebm::kMkvPrimaryGChromaticityY);
  }
  if (b_) {
    size += b_->PrimaryChromaticitySize(libwebm::kMkvPrimaryBChromaticityX,
                                        libwebm::kMkvPrimaryBChromaticityY);
  }
  if (white_point_) {
    size += white_point_->PrimaryChromaticitySize(
        libwebm::kMkvWhitePointChromaticityX,
        libwebm::kMkvWhitePointChromaticityY);
  }

  return size;
}